

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

void __thiscall
kj::
Table<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Callbacks>_>
::eraseImpl(Table<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Callbacks>_>
            *this,size_t pos)

{
  size_t oldPos;
  Entry *pEVar1;
  Entry *pEVar2;
  uint uVar3;
  undefined4 uVar4;
  RemoveConst<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry> *pRVar5;
  HashIndex<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Callbacks> *indexObj;
  ArrayPtr<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry> table;
  ArrayPtr<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry> table_00;
  
  pEVar1 = (this->rows).builder.ptr;
  table.size_ = (long)(this->rows).builder.pos - (long)pEVar1 >> 4;
  table.ptr = pEVar1;
  HashIndex<kj::HashMap<capnp::ClientHook*,unsigned_int>::Callbacks>::
  erase<kj::HashMap<capnp::ClientHook*,unsigned_int>::Entry,capnp::ClientHook*&>
            ((HashIndex<kj::HashMap<capnp::ClientHook*,unsigned_int>::Callbacks> *)&this->indexes,
             table,pos,&pEVar1[pos].key);
  pEVar1 = (this->rows).builder.ptr;
  pRVar5 = (this->rows).builder.pos;
  table_00.size_ = (long)pRVar5 - (long)pEVar1 >> 4;
  oldPos = table_00.size_ - 1;
  if (oldPos != pos) {
    table_00.ptr = pEVar1;
    HashIndex<kj::HashMap<capnp::ClientHook*,unsigned_int>::Callbacks>::
    move<kj::HashMap<capnp::ClientHook*,unsigned_int>::Entry,capnp::ClientHook*&>
              ((HashIndex<kj::HashMap<capnp::ClientHook*,unsigned_int>::Callbacks> *)&this->indexes,
               table_00,oldPos,pos,&pEVar1[oldPos].key);
    pEVar2 = (this->rows).builder.ptr;
    pEVar1 = pEVar2 + oldPos;
    uVar3 = pEVar1->value;
    uVar4 = *(undefined4 *)&pEVar1->field_0xc;
    pEVar2 = pEVar2 + pos;
    pEVar2->key = pEVar1->key;
    pEVar2->value = uVar3;
    *(undefined4 *)&pEVar2->field_0xc = uVar4;
    pRVar5 = (this->rows).builder.pos;
  }
  (this->rows).builder.pos = pRVar5 + -1;
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}